

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int ParseEXRMultipartHeaderFromFile
              (EXRHeader ***exr_headers,int *num_headers,EXRVersion *exr_version,char *filename,
              char **err)

{
  reference __ptr;
  size_t sVar1;
  char *in_RCX;
  long in_RDX;
  allocator_type *in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  char **in_stack_00000048;
  uchar *in_stack_00000050;
  EXRVersion *in_stack_00000058;
  size_t ret;
  EXRHeader ***in_stack_00000068;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  size_t filesize;
  FILE *fp;
  size_type in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  allocator_type *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  size_t local_40;
  FILE *local_38;
  undefined8 *local_30;
  allocator_type *local_18;
  int local_4;
  
  if ((((in_RDI == 0) || (in_RSI == (allocator_type *)0x0)) || (in_RDX == 0)) ||
     (in_RCX == (char *)0x0)) {
    if (in_R8 != (undefined8 *)0x0) {
      *in_R8 = "Invalid argument.";
    }
    local_4 = -3;
  }
  else {
    local_30 = in_R8;
    local_18 = in_RSI;
    local_38 = fopen(in_RCX,"rb");
    if (local_38 == (FILE *)0x0) {
      if (local_30 != (undefined8 *)0x0) {
        *local_30 = "Cannot read file.";
      }
      local_4 = -6;
    }
    else {
      fseek(local_38,0,2);
      local_40 = ftell(local_38);
      fseek(local_38,0,0);
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x160e92);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x160eb5);
      __ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_58,0);
      sVar1 = fread(__ptr,1,local_40,local_38);
      fclose(local_38);
      if (sVar1 == local_40) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   in_stack_ffffffffffffff28);
        local_4 = ParseEXRMultipartHeaderFromMemory
                            (in_stack_00000068,(int *)ret,in_stack_00000058,in_stack_00000050,
                             in_stack_00000048);
        in_stack_ffffffffffffff40 = local_18;
      }
      else {
        if (local_30 != (undefined8 *)0x0) {
          *local_30 = "fread error.";
        }
        local_4 = -5;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff40)
      ;
    }
  }
  return local_4;
}

Assistant:

int ParseEXRMultipartHeaderFromFile(EXRHeader ***exr_headers, int *num_headers,
                                    const EXRVersion *exr_version,
                                    const char *filename, const char **err) {
  if (exr_headers == NULL || num_headers == NULL || exr_version == NULL ||
      filename == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

#ifdef _WIN32
  FILE *fp = NULL;
  fopen_s(&fp, filename, "rb");
#else
  FILE *fp = fopen(filename, "rb");
#endif
  if (!fp) {
    if (err) {
      (*err) = "Cannot read file.";
    }
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = ftell(fp);
  fseek(fp, 0, SEEK_SET);

  std::vector<unsigned char> buf(filesize);  // @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    assert(ret == filesize);
    fclose(fp);

    if (ret != filesize) {
      if (err) {
        (*err) = "fread error.";
      }
      return TINYEXR_ERROR_INVALID_FILE;
    }
  }

  return ParseEXRMultipartHeaderFromMemory(exr_headers, num_headers,
                                           exr_version, &buf.at(0), err);
}